

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O1

void train_node(log_multi *b,single_learner *base,example *ec,uint32_t *current,
               uint32_t *class_index,uint32_t param_6)

{
  uint64_t *puVar1;
  float *pfVar2;
  uint32_t *puVar3;
  float fVar4;
  uint32_t uVar5;
  uint uVar6;
  node *pnVar7;
  node_pred *pnVar8;
  uint64_t uVar9;
  
  pnVar7 = (b->nodes)._begin;
  fVar4 = pnVar7[*current].norm_Eh;
  pfVar2 = &pnVar7[*current].preds._begin[*class_index].norm_Ehk;
  (ec->l).simple.label =
       *(float *)(&DAT_00280ec4 + (ulong)(*pfVar2 <= fVar4 && fVar4 != *pfVar2) * 4);
  uVar5 = (b->nodes)._begin[*current].base_predictor;
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar5);
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  uVar9 = (ec->super_example_predict).ft_offset - (ulong)(uVar5 * *(int *)(base + 0xe0));
  (ec->super_example_predict).ft_offset = uVar9;
  (ec->l).multi.label = 0x7f7fffff;
  uVar5 = (b->nodes)._begin[*current].base_predictor;
  (ec->super_example_predict).ft_offset = *(int *)(base + 0xe0) * uVar5 + uVar9;
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - (ulong)(uVar5 * *(int *)(base + 0xe0));
  pnVar7 = (b->nodes)._begin;
  pnVar7[*current].Eh = (double)ec->partial_prediction + pnVar7[*current].Eh;
  pnVar8 = (b->nodes)._begin[*current].preds._begin;
  pnVar8[*class_index].Ehk = (double)ec->partial_prediction + pnVar8[*class_index].Ehk;
  puVar3 = &(b->nodes)._begin[*current].n;
  *puVar3 = *puVar3 + 1;
  puVar3 = &(b->nodes)._begin[*current].preds._begin[*class_index].nk;
  *puVar3 = *puVar3 + 1;
  uVar6 = *current;
  pnVar7 = (b->nodes)._begin;
  pnVar7[uVar6].norm_Eh = (float)pnVar7[uVar6].Eh / (float)pnVar7[uVar6].n;
  uVar6 = *class_index;
  pnVar8 = (b->nodes)._begin[*current].preds._begin;
  pnVar8[uVar6].norm_Ehk = (float)pnVar8[uVar6].Ehk / (float)pnVar8[uVar6].nk;
  return;
}

Assistant:

void train_node(
    log_multi& b, single_learner& base, example& ec, uint32_t& current, uint32_t& class_index, uint32_t /* depth */)
{
  if (b.nodes[current].norm_Eh > b.nodes[current].preds[class_index].norm_Ehk)
    ec.l.simple.label = -1.f;
  else
    ec.l.simple.label = 1.f;

  base.learn(ec, b.nodes[current].base_predictor);  // depth

  ec.l.simple.label = FLT_MAX;
  base.predict(ec, b.nodes[current].base_predictor);  // depth

  b.nodes[current].Eh += (double)ec.partial_prediction;
  b.nodes[current].preds[class_index].Ehk += (double)ec.partial_prediction;
  b.nodes[current].n++;
  b.nodes[current].preds[class_index].nk++;

  b.nodes[current].norm_Eh = (float)b.nodes[current].Eh / b.nodes[current].n;
  b.nodes[current].preds[class_index].norm_Ehk =
      (float)b.nodes[current].preds[class_index].Ehk / b.nodes[current].preds[class_index].nk;
}